

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

bool __thiscall
ONX_Model::IncrementalReadBegin
          (ONX_Model *this,ON_BinaryArchive *archive,bool bManageComponents,uint table_filter,
          ON_TextLog *error_log)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ON_3dmSettings *pOVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  ON_UUID *pOVar28;
  ON_Layer *pOVar29;
  ON_ModelComponent *pOVar30;
  ON_Layer *this_00;
  uint uVar31;
  bool bVar32;
  ON_UUID layer_model_id;
  ON_UUID current_layer_id;
  ON_UUID settings_current_id_2;
  ON_UUID settings_current_id;
  char local_bc;
  ON_UUID local_b8;
  uint local_9c;
  undefined1 local_98 [16];
  ON_3dmSettings *local_88;
  undefined1 local_80 [80];
  
  Reset(this);
  bVar22 = ON_BinaryArchive::Read3dmStartSection
                     (archive,&this->m_3dm_file_version,&this->m_sStartSectionComments);
  if (!bVar22) {
    return false;
  }
  bVar22 = ON_BinaryArchive::Read3dmProperties(archive,&this->m_properties);
  if (!bVar22) {
    return false;
  }
  uVar25 = ON_BinaryArchive::ArchiveOpenNURBSVersion(archive);
  this->m_3dm_opennurbs_version = uVar25;
  local_88 = &this->m_settings;
  bVar22 = ON_BinaryArchive::Read3dmSettings(archive,local_88);
  if (!bVar22) {
    return false;
  }
  uVar31 = (uint)bManageComponents;
  uVar25 = -(uint)(table_filter == 0) | table_filter;
  bVar22 = ON_BinaryArchive::BeginRead3dmBitmapTable(archive);
  if (bVar22) {
    if ((uVar25 & 8) != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_98._8_8_;
      local_98 = auVar1 << 0x40;
      iVar26 = ON_BinaryArchive::Read3dmBitmap(archive,(ON_Bitmap **)local_98);
      if (0 < iVar26) {
        do {
          AddModelComponentForExperts
                    ((ONX_Model *)local_80,(ON_ModelComponent *)this,local_98[0],bManageComponents,
                     true);
          bVar22 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_80);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_80);
          if ((bVar22) && ((ON_InstanceDefinition *)local_98._0_8_ != (ON_InstanceDefinition *)0x0))
          {
            (*(((ON_ModelComponent *)local_98._0_8_)->super_ON_Object)._vptr_ON_Object[4])();
          }
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_98._8_8_;
          local_98 = auVar11 << 0x40;
          iVar26 = ON_BinaryArchive::Read3dmBitmap(archive,(ON_Bitmap **)local_98);
        } while (0 < iVar26);
      }
    }
    bVar22 = ON_BinaryArchive::EndRead3dmBitmapTable(archive);
    if (!bVar22) {
      return false;
    }
  }
  bVar22 = ON_BinaryArchive::BeginRead3dmTextureMappingTable(archive);
  local_bc = (char)uVar25;
  if (bVar22) {
    if ((uVar25 & 0x10) != 0) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_98._8_8_;
      local_98 = auVar2 << 0x40;
      iVar26 = ON_BinaryArchive::Read3dmTextureMapping(archive,(ON_TextureMapping **)local_98);
      if (0 < iVar26) {
        do {
          AddModelComponentForExperts
                    ((ONX_Model *)local_80,(ON_ModelComponent *)this,local_98[0],bManageComponents,
                     true);
          bVar22 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_80);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_80);
          if ((bVar22) && ((ON_InstanceDefinition *)local_98._0_8_ != (ON_InstanceDefinition *)0x0))
          {
            (*(((ON_ModelComponent *)local_98._0_8_)->super_ON_Object)._vptr_ON_Object[4])();
          }
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_98._8_8_;
          local_98 = auVar12 << 0x40;
          iVar26 = ON_BinaryArchive::Read3dmTextureMapping(archive,(ON_TextureMapping **)local_98);
        } while (0 < iVar26);
      }
    }
    bVar22 = ON_BinaryArchive::EndRead3dmTextureMappingTable(archive);
    if (!bVar22) {
      return false;
    }
  }
  bVar22 = ON_BinaryArchive::BeginRead3dmMaterialTable(archive);
  pOVar21 = local_88;
  if (bVar22) {
    local_80._0_16_ = (undefined1  [16])ON_3dmSettings::CurrentMaterialId(local_88);
    iVar26 = ON_3dmSettings::CurrentMaterialIndex(pOVar21);
    bVar22 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)local_80);
    ON_3dmSettings::SetCurrentMaterialId(pOVar21,(ON_UUID)ZEXT816((ulong)0));
    if ((uVar25 & 0x20) != 0) {
      auVar3._8_8_ = 0;
      auVar3[0] = local_b8.Data4[0];
      auVar3[1] = local_b8.Data4[1];
      auVar3[2] = local_b8.Data4[2];
      auVar3[3] = local_b8.Data4[3];
      auVar3[4] = local_b8.Data4[4];
      auVar3[5] = local_b8.Data4[5];
      auVar3[6] = local_b8.Data4[6];
      auVar3[7] = local_b8.Data4[7];
      local_b8 = (ON_UUID)(auVar3 << 0x40);
      iVar27 = ON_BinaryArchive::Read3dmMaterial(archive,(ON_Material **)&local_b8);
      if (0 < iVar27) {
        bVar32 = !bVar22;
        bVar22 = -1 < iVar26 && bVar22;
        local_9c = uVar31;
        do {
          if (bVar32) {
            pOVar28 = ON_ModelComponent::Id((ON_ModelComponent *)local_b8._0_8_);
            bVar23 = ::operator==((ON_UUID_struct *)local_80,pOVar28);
            if ((!bVar23) && (bVar22)) {
LAB_00463d0a:
              iVar27 = ON_ModelComponent::Index((ON_ModelComponent *)local_b8._0_8_);
              bVar23 = iVar26 == iVar27;
            }
          }
          else {
            if (bVar22) goto LAB_00463d0a;
            bVar23 = false;
          }
          AddModelComponentForExperts
                    ((ONX_Model *)local_98,(ON_ModelComponent *)this,local_b8.Data1._0_1_,
                     SUB41(local_9c,0),true);
          bVar24 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_98);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_98);
          if (bVar24) {
            if ((ON_ModelComponent *)local_b8._0_8_ != (ON_ModelComponent *)0x0) {
              (*((ON_Object *)local_b8._0_8_)->_vptr_ON_Object[4])();
            }
          }
          else if (bVar23 != false) {
            pOVar28 = ON_ModelComponent::Id((ON_ModelComponent *)local_b8._0_8_);
            ON_3dmSettings::SetCurrentMaterialId(local_88,*pOVar28);
            bVar22 = false;
            bVar32 = false;
          }
          auVar13._8_8_ = 0;
          auVar13[0] = local_b8.Data4[0];
          auVar13[1] = local_b8.Data4[1];
          auVar13[2] = local_b8.Data4[2];
          auVar13[3] = local_b8.Data4[3];
          auVar13[4] = local_b8.Data4[4];
          auVar13[5] = local_b8.Data4[5];
          auVar13[6] = local_b8.Data4[6];
          auVar13[7] = local_b8.Data4[7];
          local_b8 = (ON_UUID)(auVar13 << 0x40);
          iVar27 = ON_BinaryArchive::Read3dmMaterial(archive,(ON_Material **)&local_b8);
        } while (0 < iVar27);
      }
    }
    bVar22 = ON_BinaryArchive::EndRead3dmMaterialTable(archive);
    if (!bVar22) {
      return false;
    }
  }
  bVar22 = ON_BinaryArchive::BeginRead3dmLinetypeTable(archive);
  pOVar21 = local_88;
  if (bVar22) {
    local_80._0_16_ = (undefined1  [16])ON_3dmSettings::CurrentLinePatternId(local_88);
    iVar26 = ON_3dmSettings::CurrentLinePatternIndex(pOVar21);
    bVar22 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)local_80);
    ON_3dmSettings::SetCurrentLinePatternId(pOVar21,(ON_UUID)ZEXT816((ulong)0));
    if ((uVar25 & 0x40) != 0) {
      auVar4._8_8_ = 0;
      auVar4[0] = local_b8.Data4[0];
      auVar4[1] = local_b8.Data4[1];
      auVar4[2] = local_b8.Data4[2];
      auVar4[3] = local_b8.Data4[3];
      auVar4[4] = local_b8.Data4[4];
      auVar4[5] = local_b8.Data4[5];
      auVar4[6] = local_b8.Data4[6];
      auVar4[7] = local_b8.Data4[7];
      local_b8 = (ON_UUID)(auVar4 << 0x40);
      iVar27 = ON_BinaryArchive::Read3dmLinetype(archive,(ON_Linetype **)&local_b8);
      if (0 < iVar27) {
        bVar32 = !bVar22;
        bVar22 = -1 < iVar26 && bVar22;
        local_9c = uVar31;
        do {
          if (bVar32) {
            pOVar28 = ON_ModelComponent::Id((ON_ModelComponent *)local_b8._0_8_);
            bVar23 = ::operator==((ON_UUID_struct *)local_80,pOVar28);
            if ((!bVar23) && (bVar22)) {
LAB_00463e9c:
              iVar27 = ON_ModelComponent::Index((ON_ModelComponent *)local_b8._0_8_);
              bVar23 = iVar26 == iVar27;
            }
          }
          else {
            if (bVar22) goto LAB_00463e9c;
            bVar23 = false;
          }
          AddModelComponentForExperts
                    ((ONX_Model *)local_98,(ON_ModelComponent *)this,local_b8.Data1._0_1_,
                     SUB41(local_9c,0),true);
          bVar24 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_98);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_98);
          if (bVar24) {
            if ((ON_ModelComponent *)local_b8._0_8_ != (ON_ModelComponent *)0x0) {
              (*((ON_Object *)local_b8._0_8_)->_vptr_ON_Object[4])();
            }
          }
          else if (bVar23 != false) {
            pOVar28 = ON_ModelComponent::Id((ON_ModelComponent *)local_b8._0_8_);
            ON_3dmSettings::SetCurrentLinePatternId(local_88,*pOVar28);
            bVar22 = false;
            bVar32 = false;
          }
          auVar14._8_8_ = 0;
          auVar14[0] = local_b8.Data4[0];
          auVar14[1] = local_b8.Data4[1];
          auVar14[2] = local_b8.Data4[2];
          auVar14[3] = local_b8.Data4[3];
          auVar14[4] = local_b8.Data4[4];
          auVar14[5] = local_b8.Data4[5];
          auVar14[6] = local_b8.Data4[6];
          auVar14[7] = local_b8.Data4[7];
          local_b8 = (ON_UUID)(auVar14 << 0x40);
          iVar27 = ON_BinaryArchive::Read3dmLinetype(archive,(ON_Linetype **)&local_b8);
        } while (0 < iVar27);
      }
    }
    bVar22 = ON_BinaryArchive::EndRead3dmLinetypeTable(archive);
    if (!bVar22) {
      return false;
    }
  }
  bVar22 = ON_BinaryArchive::BeginRead3dmLayerTable(archive);
  pOVar21 = local_88;
  if (bVar22) {
    local_98 = (undefined1  [16])ON_3dmSettings::CurrentLayerId(local_88);
    iVar26 = ON_3dmSettings::CurrentLayerIndex(pOVar21);
    bVar22 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)local_98);
    ON_3dmSettings::SetCurrentLayerId(pOVar21,(ON_UUID)ZEXT816((ulong)0));
    if (local_bc < '\0') {
      auVar5._8_8_ = 0;
      auVar5[0] = local_b8.Data4[0];
      auVar5[1] = local_b8.Data4[1];
      auVar5[2] = local_b8.Data4[2];
      auVar5[3] = local_b8.Data4[3];
      auVar5[4] = local_b8.Data4[4];
      auVar5[5] = local_b8.Data4[5];
      auVar5[6] = local_b8.Data4[6];
      auVar5[7] = local_b8.Data4[7];
      local_b8 = (ON_UUID)(auVar5 << 0x40);
      iVar27 = ON_BinaryArchive::Read3dmLayer(archive,(ON_Layer **)&local_b8);
      if (0 < iVar27) {
        bVar32 = !bVar22;
        bVar22 = -1 < iVar26 && bVar22;
        local_9c = uVar31;
        do {
          if (bVar32) {
            pOVar28 = ON_ModelComponent::Id((ON_ModelComponent *)local_b8._0_8_);
            bVar23 = ::operator==((ON_UUID_struct *)local_98,pOVar28);
            if ((!bVar23) && (bVar22)) {
LAB_0046402e:
              iVar27 = ON_ModelComponent::Index((ON_ModelComponent *)local_b8._0_8_);
              bVar23 = iVar26 == iVar27;
            }
          }
          else {
            if (bVar22) goto LAB_0046402e;
            bVar23 = false;
          }
          AddModelComponentForExperts
                    ((ONX_Model *)local_80,(ON_ModelComponent *)this,local_b8.Data1._0_1_,
                     SUB41(local_9c,0),true);
          bVar24 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_80);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_80);
          if (bVar24) {
            if ((ON_ModelComponent *)local_b8._0_8_ != (ON_ModelComponent *)0x0) {
              (*((ON_Object *)local_b8._0_8_)->_vptr_ON_Object[4])();
            }
          }
          else if (bVar23 != false) {
            pOVar28 = ON_ModelComponent::Id((ON_ModelComponent *)local_b8._0_8_);
            ON_3dmSettings::SetCurrentLayerId(local_88,*pOVar28);
            bVar22 = false;
            bVar32 = false;
          }
          auVar15._8_8_ = 0;
          auVar15[0] = local_b8.Data4[0];
          auVar15[1] = local_b8.Data4[1];
          auVar15[2] = local_b8.Data4[2];
          auVar15[3] = local_b8.Data4[3];
          auVar15[4] = local_b8.Data4[4];
          auVar15[5] = local_b8.Data4[5];
          auVar15[6] = local_b8.Data4[6];
          auVar15[7] = local_b8.Data4[7];
          local_b8 = (ON_UUID)(auVar15 << 0x40);
          iVar27 = ON_BinaryArchive::Read3dmLayer(archive,(ON_Layer **)&local_b8);
        } while (0 < iVar27);
      }
    }
    bVar22 = ON_BinaryArchive::EndRead3dmLayerTable(archive);
    if (!bVar22) {
      return false;
    }
    local_b8 = ON_3dmSettings::CurrentLayerId(local_88);
    bVar22 = ::operator==(&ON_nil_uuid,&local_b8);
    if (!bVar22) {
      layer_model_id.Data4 = (uchar  [8])local_b8._0_8_;
      layer_model_id._0_8_ = this;
      LayerFromId((ONX_Model *)local_80,layer_model_id);
      pOVar29 = ON_Layer::FromModelComponentRef
                          ((ON_ModelComponentReference *)local_80,(ON_Layer *)0x0);
      ON_ModelComponentReference::~ON_ModelComponentReference
                ((ON_ModelComponentReference *)local_80);
      if (pOVar29 != (ON_Layer *)0x0) goto LAB_00464232;
    }
    local_b8 = (ON_UUID)ZEXT816((ulong)0);
    ONX_ModelComponentIterator::ONX_ModelComponentIterator
              ((ONX_ModelComponentIterator *)local_80,this,Layer);
    pOVar30 = ONX_ModelComponentIterator::FirstComponent((ONX_ModelComponentIterator *)local_80);
    this_00 = ON_Layer::Cast(&pOVar30->super_ON_Object);
    iVar26 = 0;
    pOVar29 = (ON_Layer *)0x0;
    while (this_00 != (ON_Layer *)0x0) {
      bVar22 = ON_Layer::IsVisible(this_00);
      if (((bVar22) &&
          (bVar22 = ON_ModelComponent::IsLocked(&this_00->super_ON_ModelComponent), !bVar22)) &&
         (bVar22 = ON_ModelComponent::ParentIdIsNil(&this_00->super_ON_ModelComponent),
         pOVar29 = this_00, bVar22)) goto LAB_004641f7;
      pOVar30 = ONX_ModelComponentIterator::NextComponent((ONX_ModelComponentIterator *)local_80);
      iVar26 = iVar26 + -1;
      this_00 = ON_Layer::Cast(&pOVar30->super_ON_Object);
    }
    this_00 = pOVar29;
    if (pOVar29 == (ON_Layer *)0x0 && iVar26 != 0) {
      pOVar30 = ONX_ModelComponentIterator::FirstComponent((ONX_ModelComponentIterator *)local_80);
      this_00 = ON_Layer::Cast(&pOVar30->super_ON_Object);
    }
    if (this_00 == (ON_Layer *)0x0) {
      AddDefaultLayer(this,(wchar_t *)0x0,ON_Color::UnsetColor);
    }
    else {
LAB_004641f7:
      pOVar28 = ON_ModelComponent::Id(&this_00->super_ON_ModelComponent);
      ON_3dmSettings::SetCurrentLayerId(local_88,*pOVar28);
    }
    ON_ModelComponentWeakReference::~ON_ModelComponentWeakReference
              ((ON_ModelComponentWeakReference *)(local_80 + 0x40));
  }
LAB_00464232:
  bVar22 = ON_BinaryArchive::BeginRead3dmGroupTable(archive);
  if (bVar22) {
    if ((uVar25 >> 8 & 1) != 0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_98._8_8_;
      local_98 = auVar6 << 0x40;
      iVar26 = ON_BinaryArchive::Read3dmGroup(archive,(ON_Group **)local_98);
      if (0 < iVar26) {
        do {
          AddModelComponentForExperts
                    ((ONX_Model *)local_80,(ON_ModelComponent *)this,local_98[0],bManageComponents,
                     true);
          bVar22 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_80);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_80);
          if ((bVar22) && ((ON_InstanceDefinition *)local_98._0_8_ != (ON_InstanceDefinition *)0x0))
          {
            (*(((ON_ModelComponent *)local_98._0_8_)->super_ON_Object)._vptr_ON_Object[4])();
          }
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_98._8_8_;
          local_98 = auVar16 << 0x40;
          iVar26 = ON_BinaryArchive::Read3dmGroup(archive,(ON_Group **)local_98);
        } while (0 < iVar26);
      }
    }
    bVar22 = ON_BinaryArchive::EndRead3dmGroupTable(archive);
    if (!bVar22) {
      return false;
    }
  }
  bVar22 = ON_BinaryArchive::BeginRead3dmDimStyleTable(archive);
  pOVar21 = local_88;
  if (bVar22) {
    local_80._0_16_ = (undefined1  [16])ON_3dmSettings::CurrentDimensionStyleId(local_88);
    iVar26 = ON_3dmSettings::CurrentDimensionStyleIndex(pOVar21);
    bVar22 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)local_80);
    ON_3dmSettings::SetCurrentDimensionStyleId(pOVar21,(ON_UUID)ZEXT816((ulong)0));
    if ((uVar25 >> 0xb & 1) != 0) {
      auVar7._8_8_ = 0;
      auVar7[0] = local_b8.Data4[0];
      auVar7[1] = local_b8.Data4[1];
      auVar7[2] = local_b8.Data4[2];
      auVar7[3] = local_b8.Data4[3];
      auVar7[4] = local_b8.Data4[4];
      auVar7[5] = local_b8.Data4[5];
      auVar7[6] = local_b8.Data4[6];
      auVar7[7] = local_b8.Data4[7];
      local_b8 = (ON_UUID)(auVar7 << 0x40);
      iVar27 = ON_BinaryArchive::Read3dmDimStyle(archive,(ON_DimStyle **)&local_b8);
      if (0 < iVar27) {
        bVar32 = !bVar22;
        bVar22 = -1 < iVar26 && bVar22;
        local_9c = uVar31;
        do {
          if (bVar32) {
            pOVar28 = ON_ModelComponent::Id((ON_ModelComponent *)local_b8._0_8_);
            bVar23 = ::operator==((ON_UUID_struct *)local_80,pOVar28);
            if ((!bVar23) && (bVar22)) {
LAB_004643bd:
              iVar27 = ON_ModelComponent::Index((ON_ModelComponent *)local_b8._0_8_);
              bVar23 = iVar26 == iVar27;
            }
          }
          else {
            if (bVar22) goto LAB_004643bd;
            bVar23 = false;
          }
          AddModelComponentForExperts
                    ((ONX_Model *)local_98,(ON_ModelComponent *)this,local_b8.Data1._0_1_,
                     SUB41(local_9c,0),true);
          bVar24 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_98);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_98);
          if (bVar24) {
            if ((ON_ModelComponent *)local_b8._0_8_ != (ON_ModelComponent *)0x0) {
              (*((ON_Object *)local_b8._0_8_)->_vptr_ON_Object[4])();
            }
          }
          else if (bVar23 != false) {
            pOVar28 = ON_ModelComponent::Id((ON_ModelComponent *)local_b8._0_8_);
            ON_3dmSettings::SetCurrentDimensionStyleId(local_88,*pOVar28);
            bVar32 = false;
            bVar22 = false;
          }
          auVar17._8_8_ = 0;
          auVar17[0] = local_b8.Data4[0];
          auVar17[1] = local_b8.Data4[1];
          auVar17[2] = local_b8.Data4[2];
          auVar17[3] = local_b8.Data4[3];
          auVar17[4] = local_b8.Data4[4];
          auVar17[5] = local_b8.Data4[5];
          auVar17[6] = local_b8.Data4[6];
          auVar17[7] = local_b8.Data4[7];
          local_b8 = (ON_UUID)(auVar17 << 0x40);
          iVar27 = ON_BinaryArchive::Read3dmDimStyle(archive,(ON_DimStyle **)&local_b8);
        } while (0 < iVar27);
      }
    }
    bVar22 = ON_BinaryArchive::EndRead3dmDimStyleTable(archive);
    if (!bVar22) {
      return false;
    }
  }
  bVar22 = ON_BinaryArchive::BeginRead3dmLightTable(archive);
  if (bVar22) {
    if ((uVar25 >> 0xc & 1) != 0) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_98._8_8_;
      local_98 = auVar8 << 0x40;
      iVar26 = ON_BinaryArchive::Read3dmModelLight(archive,(ON_ModelGeometryComponent **)local_98);
      if (0 < iVar26) {
        do {
          AddModelComponentForExperts
                    ((ONX_Model *)local_80,(ON_ModelComponent *)this,local_98[0],bManageComponents,
                     true);
          bVar22 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_80);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_80);
          if ((bVar22) && ((ON_InstanceDefinition *)local_98._0_8_ != (ON_InstanceDefinition *)0x0))
          {
            (*(((ON_ModelComponent *)local_98._0_8_)->super_ON_Object)._vptr_ON_Object[4])();
          }
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_98._8_8_;
          local_98 = auVar18 << 0x40;
          iVar26 = ON_BinaryArchive::Read3dmModelLight
                             (archive,(ON_ModelGeometryComponent **)local_98);
        } while (0 < iVar26);
      }
    }
    bVar22 = ON_BinaryArchive::EndRead3dmLightTable(archive);
    if (!bVar22) {
      return false;
    }
  }
  bVar22 = ON_BinaryArchive::BeginRead3dmHatchPatternTable(archive);
  pOVar21 = local_88;
  if (bVar22) {
    local_80._0_16_ = (undefined1  [16])ON_3dmSettings::CurrentHatchPatternId(local_88);
    bVar22 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)local_80);
    ON_3dmSettings::SetCurrentHatchPatternId(pOVar21,(ON_UUID)ZEXT816((ulong)0));
    if ((uVar25 >> 0xd & 1) != 0) {
      auVar9._8_8_ = 0;
      auVar9[0] = local_b8.Data4[0];
      auVar9[1] = local_b8.Data4[1];
      auVar9[2] = local_b8.Data4[2];
      auVar9[3] = local_b8.Data4[3];
      auVar9[4] = local_b8.Data4[4];
      auVar9[5] = local_b8.Data4[5];
      auVar9[6] = local_b8.Data4[6];
      auVar9[7] = local_b8.Data4[7];
      local_b8 = (ON_UUID)(auVar9 << 0x40);
      iVar26 = ON_BinaryArchive::Read3dmHatchPattern(archive,(ON_HatchPattern **)&local_b8);
      if (0 < iVar26) {
        bVar22 = !bVar22;
        do {
          if (bVar22) {
            pOVar28 = ON_ModelComponent::Id((ON_ModelComponent *)local_b8._0_8_);
            bVar23 = ::operator==((ON_UUID_struct *)local_80,pOVar28);
            bVar32 = true;
            if (!bVar23) goto LAB_004645d2;
          }
          else {
LAB_004645d2:
            bVar32 = false;
          }
          AddModelComponentForExperts
                    ((ONX_Model *)local_98,(ON_ModelComponent *)this,local_b8.Data1._0_1_,
                     bManageComponents,true);
          bVar23 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_98);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_98);
          if (bVar23) {
            if ((ON_ModelComponent *)local_b8._0_8_ != (ON_ModelComponent *)0x0) {
              (*((ON_Object *)local_b8._0_8_)->_vptr_ON_Object[4])();
            }
          }
          else if (bVar32) {
            pOVar28 = ON_ModelComponent::Id((ON_ModelComponent *)local_b8._0_8_);
            ON_3dmSettings::SetCurrentHatchPatternId(local_88,*pOVar28);
            bVar22 = false;
          }
          auVar19._8_8_ = 0;
          auVar19[0] = local_b8.Data4[0];
          auVar19[1] = local_b8.Data4[1];
          auVar19[2] = local_b8.Data4[2];
          auVar19[3] = local_b8.Data4[3];
          auVar19[4] = local_b8.Data4[4];
          auVar19[5] = local_b8.Data4[5];
          auVar19[6] = local_b8.Data4[6];
          auVar19[7] = local_b8.Data4[7];
          local_b8 = (ON_UUID)(auVar19 << 0x40);
          iVar26 = ON_BinaryArchive::Read3dmHatchPattern(archive,(ON_HatchPattern **)&local_b8);
        } while (0 < iVar26);
      }
    }
    bVar22 = ON_BinaryArchive::EndRead3dmHatchPatternTable(archive);
    if (!bVar22) {
      return false;
    }
  }
  bVar22 = ON_BinaryArchive::BeginRead3dmInstanceDefinitionTable(archive);
  if (bVar22) {
    if ((uVar25 >> 0xe & 1) != 0) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_98._8_8_;
      local_98 = auVar10 << 0x40;
      iVar26 = ON_BinaryArchive::Read3dmInstanceDefinition
                         (archive,(ON_InstanceDefinition **)local_98);
      if (0 < iVar26) {
        do {
          AddModelComponentForExperts
                    ((ONX_Model *)local_80,(ON_ModelComponent *)this,local_98[0],bManageComponents,
                     true);
          bVar22 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_80);
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_80);
          if ((bVar22) && ((ON_InstanceDefinition *)local_98._0_8_ != (ON_InstanceDefinition *)0x0))
          {
            (*(((ON_ModelComponent *)local_98._0_8_)->super_ON_Object)._vptr_ON_Object[4])();
          }
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_98._8_8_;
          local_98 = auVar20 << 0x40;
          iVar26 = ON_BinaryArchive::Read3dmInstanceDefinition
                             (archive,(ON_InstanceDefinition **)local_98);
        } while (0 < iVar26);
      }
    }
    bVar22 = ON_BinaryArchive::EndRead3dmInstanceDefinitionTable(archive);
    if (!bVar22) {
      return false;
    }
  }
  uVar25 = ON_BinaryArchive::CriticalErrorCount(archive);
  return uVar25 == 0;
}

Assistant:

bool ONX_Model::IncrementalReadBegin( 
  ON_BinaryArchive& archive,
  bool bManageComponents,
  unsigned int table_filter,
  ON_TextLog* error_log
  )
{
  Reset();

  const bool bResolveIdAndNameConflicts = true;
  const bool bUpdateComponentIdentification = true;

  int rc;

  if ( 0 == table_filter )
    table_filter = 0xFFFFFFFF; // read everything

  // STEP 1: REQUIRED - Read start section
  if ( !archive.Read3dmStartSection( &m_3dm_file_version, m_sStartSectionComments ) )
  {
    return false;
  }

  // STEP 2: REQUIRED - Read properties section
  if ( !archive.Read3dmProperties( m_properties ) )
  {
    return false;
  }

  // version of opennurbs used to write the file.
  m_3dm_opennurbs_version = archive.ArchiveOpenNURBSVersion();

  // STEP 3: REQUIRED - Read setting section
  if ( !archive.Read3dmSettings( m_settings ) )
  {
    return false;
  }

  // STEP 4: REQUIRED - Read embedded bitmap table
  if ( archive.BeginRead3dmBitmapTable() )
  {
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::bitmap_table) & table_filter) )
    {
      for(;;)
      {
        ON_Bitmap* bitmap = nullptr;
        rc = archive.Read3dmBitmap(&bitmap);
        if ( rc==0 )
          break; // end of bitmap table
        if (rc < 0)
          break;
        if ( AddModelComponentForExperts(bitmap,bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty() )
          delete bitmap;
      }
    }

    // If BeginRead3dmBitmapTable() returns true, 
    // then you MUST call EndRead3dmBitmapTable().
    if ( !archive.EndRead3dmBitmapTable() )
    {
      return false;
    }
  }

  // STEP 5: REQUIRED - Read texture mapping table
  if ( archive.BeginRead3dmTextureMappingTable() )
  {
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::texture_mapping_table) & table_filter) )
    {
      for(;;)
      {
        ON_TextureMapping* texture_mapping = nullptr;
        rc = archive.Read3dmTextureMapping(&texture_mapping);
        if ( rc==0 )
          break; // end of texture_mapping table
        if ( rc < 0 ) 
          break;
        if (AddModelComponentForExperts(texture_mapping, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
          delete texture_mapping;
      }
    }
    
    // If BeginRead3dmTextureMappingTable() returns true, 
    // then you MUST call EndRead3dmTextureMappingTable().
    if ( !archive.EndRead3dmTextureMappingTable() )
    {
      return false;
    }
  }


  // STEP 6: REQUIRED - Read render material table
  if ( archive.BeginRead3dmMaterialTable() )
  {
    const ON_UUID settings_current_id = m_settings.CurrentMaterialId();
    const int settings_current_index = m_settings.CurrentMaterialIndex();
    bool bSetCurrentById = !(ON_nil_uuid == settings_current_id);
    bool bSetCurrentByIndex = false == bSetCurrentById && settings_current_index >= 0;
    m_settings.SetCurrentMaterialId(ON_nil_uuid);
    
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::material_table) & table_filter) )
    {
      for(;;)
      {
        ON_Material* material = nullptr;
        rc = archive.Read3dmMaterial(&material);
        if ( rc==0 )
          break; // end of material table
        if (rc < 0)
          break;
        // index or id might be modified by AddModelComponentForExperts()
        const bool bSetAsCurrent =
          (bSetCurrentById && settings_current_id == material->Id())
          || (bSetCurrentByIndex && settings_current_index == material->Index());
        if ( AddModelComponentForExperts(material,bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty() )
        {
          delete material;
        }
        else if (bSetAsCurrent)
        {
          m_settings.SetCurrentMaterialId(material->Id());
          bSetCurrentById = false;
          bSetCurrentByIndex = false;
        }
      }
    }

    // If BeginRead3dmMaterialTable() returns true, 
    // then you MUST call EndRead3dmMaterialTable().
    if ( !archive.EndRead3dmMaterialTable() )
    {
      return false;
    }
  }


  // STEP 7: REQUIRED - Read line type table
  if ( archive.BeginRead3dmLinetypeTable() )
  {
    const ON_UUID settings_current_id = m_settings.CurrentLinePatternId();
    const int settings_current_index = m_settings.CurrentLinePatternIndex();
    bool bSetCurrentById = !(ON_nil_uuid == settings_current_id);
    bool bSetCurrentByIndex = false == bSetCurrentById && settings_current_index >= 0;
    m_settings.SetCurrentLinePatternId(ON_nil_uuid);

    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::linetype_table) & table_filter) )
    {
      for(;;)
      {
        ON_Linetype* line_pattern = nullptr;
        rc = archive.Read3dmLinetype(&line_pattern);
        if ( rc==0 )
          break; // end of linetype table
        if (rc < 0)
          break;
        // index or id might be modified by AddModelComponentForExperts()
        const bool bSetAsCurrent =
          (bSetCurrentById && settings_current_id == line_pattern->Id())
          || (bSetCurrentByIndex && settings_current_index == line_pattern->Index());
        if ( AddModelComponentForExperts(line_pattern,bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty() )
        {
          delete line_pattern;
        }
        else if (bSetAsCurrent)
        {
          m_settings.SetCurrentLinePatternId(line_pattern->Id());
          bSetCurrentById = false;
          bSetCurrentByIndex = false;
        }
      }
    }

    // If BeginRead3dmLinetypeTable() returns true, 
    // then you MUST call EndRead3dmLinetypeTable().
    if ( !archive.EndRead3dmLinetypeTable() )
    {
      return false;
    }
  }

  // STEP 8: REQUIRED - Read layer table
  if ( archive.BeginRead3dmLayerTable() )
  {
    const ON_UUID settings_current_id = m_settings.CurrentLayerId();
    const int settings_current_index = m_settings.CurrentLayerIndex();
    bool bSetCurrentById = !(ON_nil_uuid == settings_current_id);
    bool bSetCurrentByIndex = false == bSetCurrentById && settings_current_index >= 0;
    m_settings.SetCurrentLayerId(ON_nil_uuid);

    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::layer_table) & table_filter) )
    {
      for(;;)
      {
        ON_Layer* layer = nullptr;
        rc = archive.Read3dmLayer(&layer);
        if ( rc==0 )
          break; // end of layer table
        if (rc < 0)
          break;
        // index or id might be modified by AddModelComponentForExperts()
        const bool bSetAsCurrent =
          (bSetCurrentById && settings_current_id == layer->Id())
          || (bSetCurrentByIndex && settings_current_index == layer->Index());
        if (AddModelComponentForExperts(layer, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
        {
          delete layer;
        }
        else if (bSetAsCurrent)
        {
          m_settings.SetCurrentLayerId(layer->Id());
          bSetCurrentById = false;
          bSetCurrentByIndex = false;
        }
      }
    }

    // If BeginRead3dmLayerTable() returns true, 
    // then you MUST call EndRead3dmLayerTable().
    if ( !archive.EndRead3dmLayerTable() )
    {
      return false;
    }

    ON_UUID current_layer_id = m_settings.CurrentLayerId();
    const ON_Layer* current_layer 
      = (ON_nil_uuid == current_layer_id)
      ? nullptr
      : ON_Layer::FromModelComponentRef(LayerFromId(current_layer_id), nullptr);
    if (nullptr == current_layer)
    {
      current_layer_id = ON_nil_uuid;
      int layer_count = 0;
      ONX_ModelComponentIterator layer_it(*this, ON_ModelComponent::Type::Layer);
      for (const ON_Layer* layer = ON_Layer::Cast(layer_it.FirstComponent()); nullptr != layer; layer = ON_Layer::Cast(layer_it.NextComponent()))
      {
        layer_count++;
        if (layer->IsVisible() && false == layer->IsLocked())
        {
          current_layer = layer;
          if ( layer->ParentIdIsNil() )
            break;
        }
      }
      if (nullptr == current_layer && layer_count > 0)
      {
        current_layer = ON_Layer::Cast(layer_it.FirstComponent());
      }
      if (nullptr != current_layer)
        m_settings.SetCurrentLayerId(current_layer->Id());
      else
        AddDefaultLayer(nullptr, ON_Color::UnsetColor);
    }
  }

  // STEP 9: REQUIRED - Read group table
  if ( archive.BeginRead3dmGroupTable() )
  {
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::group_table) & table_filter) )
    {
      for(;;)
      {
        ON_Group* group = nullptr;
        rc = archive.Read3dmGroup(&group);
        if ( rc==0 )
          break; // end of group table
        if (rc < 0)
          break;
        if (AddModelComponentForExperts(group, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
          delete group;
      }
    }
    
    // If BeginRead3dmGroupTable() returns true, 
    // then you MUST call EndRead3dmGroupTable().
    if ( !archive.EndRead3dmGroupTable() )
    {
      return false;
    }
  }

  // STEP 11: REQUIRED - Read dimstyle table
  if ( archive.BeginRead3dmDimStyleTable() )
  {
    const ON_UUID settings_current_id = m_settings.CurrentDimensionStyleId();
    const int settings_current_index = m_settings.CurrentDimensionStyleIndex();
    bool bSetCurrentById = !(ON_nil_uuid == settings_current_id);
    bool bSetCurrentByIndex = false == bSetCurrentById && settings_current_index >= 0;
    m_settings.SetCurrentDimensionStyleId(ON_nil_uuid);

    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::dimension_style_table) & table_filter) )
    {
      for(;;)
      {
        ON_DimStyle* dimension_style = nullptr;
        rc = archive.Read3dmDimStyle(&dimension_style);
        if ( rc==0 )
          break; // end of dimstyle table
        if ( rc < 0 ) 
          break;
        // index or id might be modified by AddModelComponentForExperts()
        const bool bSetAsCurrent =
          (bSetCurrentById && settings_current_id == dimension_style->Id())
          || (bSetCurrentByIndex && settings_current_index == dimension_style->Index());
        if (AddModelComponentForExperts(dimension_style, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
        {
          delete dimension_style;
        }
        else if (bSetAsCurrent)
        {
          m_settings.SetCurrentDimensionStyleId(dimension_style->Id());
          bSetCurrentById = false;
          bSetCurrentByIndex = false;
        }
      }
    }
    
    // If BeginRead3dmDimStyleTable() returns true, 
    // then you MUST call EndRead3dmDimStyleTable().
    if ( !archive.EndRead3dmDimStyleTable() )
    {
      return false;
    }
  }

  // STEP 12: REQUIRED - Read render lights table
  if ( archive.BeginRead3dmLightTable() )
  {
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::light_table) & table_filter) )
    {
      for(;;)
      {
        ON_ModelGeometryComponent* model_light = nullptr;
        rc = archive.Read3dmModelLight(&model_light);
        if (rc == 0)
          break; // end of light table
        if ( rc < 0 ) 
          break;
        if (AddModelComponentForExperts(model_light, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
          delete model_light;
      }
    }

    // If BeginRead3dmLightTable() returns true, 
    // then you MUST call EndRead3dmLightTable().
    if ( !archive.EndRead3dmLightTable() )
    {
      return false;
    }
  }

  // STEP 13 - read hatch pattern table
  if ( archive.BeginRead3dmHatchPatternTable() )
  {
    const ON_UUID settings_current_id = m_settings.CurrentHatchPatternId();
    const int settings_current_index = ON_UNSET_INT_INDEX;
    bool bSetCurrentById = !(ON_nil_uuid == settings_current_id);
    bool bSetCurrentByIndex = false;
    m_settings.SetCurrentHatchPatternId(ON_nil_uuid);

    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::hatchpattern_table) & table_filter) )
    {
      for(;;)
      {
        ON_HatchPattern* hatch_pattern = nullptr;
        rc = archive.Read3dmHatchPattern(&hatch_pattern);
        if ( rc==0 )
          break; // end of hatchpattern table
        if ( rc < 0 ) 
          break;
        // index or id might be modified by AddModelComponentForExperts()
        const bool bSetAsCurrent =
          (bSetCurrentById && settings_current_id == hatch_pattern->Id())
          || (bSetCurrentByIndex && settings_current_index == hatch_pattern->Index());
        if (AddModelComponentForExperts(hatch_pattern, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
        {
          delete hatch_pattern;
        }
        else if (bSetAsCurrent)
        {
          m_settings.SetCurrentHatchPatternId(hatch_pattern->Id());
          bSetCurrentById = false;
          bSetCurrentByIndex = false;
        }
      }
    }
    
    // If BeginRead3dmHatchPatternTable() returns true, 
    // then you MUST call EndRead3dmHatchPatternTable().
    if ( !archive.EndRead3dmHatchPatternTable() )
    {
      return false;
    }
  }

  // STEP 14: REQUIRED - Read instance definition table
  if ( archive.BeginRead3dmInstanceDefinitionTable() )
  {
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::instance_definition_table) & table_filter) )
    {
      for(;;)
      {
        ON_InstanceDefinition* instance_definition = nullptr;
        rc = archive.Read3dmInstanceDefinition(&instance_definition);
        if ( rc==0 )
          break; // end of instance definition table
        if ( rc < 0 ) 
          break;
        if (AddModelComponentForExperts(instance_definition, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
          delete instance_definition;
      }
    }
    
    // If BeginRead3dmInstanceDefinitionTable() returns true, 
    // then you MUST call EndRead3dmInstanceDefinitionTable().
    if ( !archive.EndRead3dmInstanceDefinitionTable() )
    {
      return false;
    }
  }

  return (0 == archive.CriticalErrorCount());
}